

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

bool __thiscall
cfd::TransactionContext::IsFindTxIn(TransactionContext *this,OutPoint *outpoint,uint32_t *index)

{
  uint32_t uVar1;
  string errmsg;
  
  uVar1 = (**(code **)(*(long *)this + 0x78))();
  if (index != (uint32_t *)0x0) {
    *index = uVar1;
  }
  return true;
}

Assistant:

bool TransactionContext::IsFindTxIn(
    const OutPoint& outpoint, uint32_t* index) const {
  static constexpr const char* const kErrorMessage = "Txid is not found.";
  try {
    uint32_t temp_index = GetTxInIndex(outpoint);
    if (index != nullptr) *index = temp_index;
    return true;
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if (errmsg == kErrorMessage) {
      return false;
    } else {
      throw except;
    }
  }
}